

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * __thiscall amrex::BoxArray::growcoarsen(BoxArray *this,IntVect *ngrow,IntVect *iv)

{
  int iVar1;
  Long LVar2;
  Box *pBVar3;
  int *in_RDX;
  IntVect *in_RSI;
  BoxArray *in_RDI;
  bool bVar4;
  int i;
  int N;
  int dir;
  IntVect off;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  int local_244;
  int local_240;
  int local_23c;
  int local_234;
  int local_230;
  int local_22c;
  int local_21c;
  int local_218;
  int local_214;
  int local_20c;
  int local_208;
  int local_204;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_188;
  int local_168;
  IntVect local_164;
  int *local_158;
  Box *local_150;
  int local_144;
  IntVect *local_140;
  int local_134;
  int *local_130;
  IntVect *local_128;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int local_78;
  int local_6c;
  int local_60;
  int local_54;
  int local_48;
  int local_3c;
  int local_30;
  int local_24;
  int local_18;
  
  uniqify((BoxArray *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0xfbc255
            );
  LVar2 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                    ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xfbc25d);
  for (local_188 = 0; local_188 < (int)LVar2; local_188 = local_188 + 1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfbc294);
    pBVar3 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                       ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                        CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    pBVar3 = Box::grow(pBVar3,in_RSI);
    bVar4 = true;
    if ((*in_RDX == 1) && (bVar4 = true, in_RDX[1] == 1)) {
      bVar4 = in_RDX[2] != 1;
    }
    local_150 = pBVar3;
    if (bVar4) {
      local_60 = (pBVar3->smallend).vect[0];
      local_1c4 = *in_RDX;
      if (local_1c4 != 1) {
        if (local_1c4 == 2) {
          if (local_60 < 0) {
            local_60 = local_60 + 1;
            if (local_60 < 1) {
              local_60 = -local_60;
            }
            local_1bc = -local_60 / 2 + -1;
          }
          else {
            local_1bc = local_60 / 2;
          }
          local_60 = local_1bc;
        }
        else if (local_1c4 == 4) {
          if (local_60 < 0) {
            local_60 = local_60 + 1;
            if (local_60 < 1) {
              local_60 = -local_60;
            }
            local_1c0 = -local_60 / 4 + -1;
          }
          else {
            local_1c0 = local_60 / 4;
          }
          local_60 = local_1c0;
        }
        else {
          if (local_60 < 0) {
            local_60 = local_60 + 1;
            if (local_60 < 1) {
              local_60 = -local_60;
            }
            local_1c4 = -local_60 / local_1c4 + -1;
          }
          else {
            local_1c4 = local_60 / local_1c4;
          }
          local_60 = local_1c4;
        }
      }
      (pBVar3->smallend).vect[0] = local_60;
      local_6c = (pBVar3->smallend).vect[1];
      local_1d4 = in_RDX[1];
      if (local_1d4 != 1) {
        if (local_1d4 == 2) {
          if (local_6c < 0) {
            local_6c = local_6c + 1;
            if (local_6c < 1) {
              local_6c = -local_6c;
            }
            local_1cc = -local_6c / 2 + -1;
          }
          else {
            local_1cc = local_6c / 2;
          }
          local_6c = local_1cc;
        }
        else if (local_1d4 == 4) {
          if (local_6c < 0) {
            local_6c = local_6c + 1;
            if (local_6c < 1) {
              local_6c = -local_6c;
            }
            local_1d0 = -local_6c / 4 + -1;
          }
          else {
            local_1d0 = local_6c / 4;
          }
          local_6c = local_1d0;
        }
        else {
          if (local_6c < 0) {
            local_6c = local_6c + 1;
            if (local_6c < 1) {
              local_6c = -local_6c;
            }
            local_1d4 = -local_6c / local_1d4 + -1;
          }
          else {
            local_1d4 = local_6c / local_1d4;
          }
          local_6c = local_1d4;
        }
      }
      (pBVar3->smallend).vect[1] = local_6c;
      local_78 = (pBVar3->smallend).vect[2];
      local_1e4 = in_RDX[2];
      if (local_1e4 != 1) {
        if (local_1e4 == 2) {
          if (local_78 < 0) {
            local_78 = local_78 + 1;
            if (local_78 < 1) {
              local_78 = -local_78;
            }
            local_1dc = -local_78 / 2 + -1;
          }
          else {
            local_1dc = local_78 / 2;
          }
          local_78 = local_1dc;
        }
        else if (local_1e4 == 4) {
          if (local_78 < 0) {
            local_78 = local_78 + 1;
            if (local_78 < 1) {
              local_78 = -local_78;
            }
            local_1e0 = -local_78 / 4 + -1;
          }
          else {
            local_1e0 = local_78 / 4;
          }
          local_78 = local_1e0;
        }
        else {
          if (local_78 < 0) {
            local_78 = local_78 + 1;
            if (local_78 < 1) {
              local_78 = -local_78;
            }
            local_1e4 = -local_78 / local_1e4 + -1;
          }
          else {
            local_1e4 = local_78 / local_1e4;
          }
          local_78 = local_1e4;
        }
      }
      (pBVar3->smallend).vect[2] = local_78;
      if ((pBVar3->btype).itype == 0) {
        local_3c = (pBVar3->bigend).vect[0];
        local_234 = *in_RDX;
        if (local_234 != 1) {
          if (local_234 == 2) {
            if (local_3c < 0) {
              local_3c = local_3c + 1;
              if (local_3c < 1) {
                local_3c = -local_3c;
              }
              local_22c = -local_3c / 2 + -1;
            }
            else {
              local_22c = local_3c / 2;
            }
            local_3c = local_22c;
          }
          else if (local_234 == 4) {
            if (local_3c < 0) {
              local_3c = local_3c + 1;
              if (local_3c < 1) {
                local_3c = -local_3c;
              }
              local_230 = -local_3c / 4 + -1;
            }
            else {
              local_230 = local_3c / 4;
            }
            local_3c = local_230;
          }
          else {
            if (local_3c < 0) {
              local_3c = local_3c + 1;
              if (local_3c < 1) {
                local_3c = -local_3c;
              }
              local_234 = -local_3c / local_234 + -1;
            }
            else {
              local_234 = local_3c / local_234;
            }
            local_3c = local_234;
          }
        }
        (pBVar3->bigend).vect[0] = local_3c;
        local_48 = (pBVar3->bigend).vect[1];
        local_244 = in_RDX[1];
        if (local_244 != 1) {
          if (local_244 == 2) {
            if (local_48 < 0) {
              local_48 = local_48 + 1;
              if (local_48 < 1) {
                local_48 = -local_48;
              }
              local_23c = -local_48 / 2 + -1;
            }
            else {
              local_23c = local_48 / 2;
            }
            local_48 = local_23c;
          }
          else if (local_244 == 4) {
            if (local_48 < 0) {
              local_48 = local_48 + 1;
              if (local_48 < 1) {
                local_48 = -local_48;
              }
              local_240 = -local_48 / 4 + -1;
            }
            else {
              local_240 = local_48 / 4;
            }
            local_48 = local_240;
          }
          else {
            if (local_48 < 0) {
              local_48 = local_48 + 1;
              if (local_48 < 1) {
                local_48 = -local_48;
              }
              local_244 = -local_48 / local_244 + -1;
            }
            else {
              local_244 = local_48 / local_244;
            }
            local_48 = local_244;
          }
        }
        (pBVar3->bigend).vect[1] = local_48;
        local_54 = (pBVar3->bigend).vect[2];
        iVar1 = in_RDX[2];
        if (iVar1 != 1) {
          if (iVar1 == 2) {
            if (local_54 < 0) {
              local_54 = local_54 + 1;
              if (local_54 < 1) {
                local_54 = -local_54;
              }
              in_stack_fffffffffffffdb4 = -local_54 / 2 + -1;
              local_54 = in_stack_fffffffffffffdb4;
            }
            else {
              in_stack_fffffffffffffdb4 = local_54 / 2;
              local_54 = in_stack_fffffffffffffdb4;
            }
          }
          else if (iVar1 == 4) {
            if (local_54 < 0) {
              local_54 = local_54 + 1;
              if (local_54 < 1) {
                local_54 = -local_54;
              }
              in_stack_fffffffffffffdb0 = -local_54 / 4 + -1;
              local_54 = in_stack_fffffffffffffdb0;
            }
            else {
              in_stack_fffffffffffffdb0 = local_54 / 4;
              local_54 = in_stack_fffffffffffffdb0;
            }
          }
          else if (local_54 < 0) {
            local_54 = local_54 + 1;
            if (local_54 < 1) {
              local_54 = -local_54;
            }
            in_stack_fffffffffffffdac = -local_54 / iVar1 + -1;
            local_54 = in_stack_fffffffffffffdac;
          }
          else {
            in_stack_fffffffffffffdac = local_54 / iVar1;
            local_54 = in_stack_fffffffffffffdac;
          }
        }
        (pBVar3->bigend).vect[2] = local_54;
      }
      else {
        local_158 = in_RDX;
        IntVect::IntVect(&local_164,0);
        for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
          if (((pBVar3->btype).itype & 1 << ((byte)local_168 & 0x1f)) != 0) {
            local_140 = &pBVar3->bigend;
            local_144 = local_168;
            local_130 = local_158;
            local_134 = local_168;
            if (local_140->vect[local_168] % local_158[local_168] != 0) {
              local_164.vect[local_168] = 1;
            }
          }
        }
        local_18 = (pBVar3->bigend).vect[0];
        local_1fc = *local_158;
        if (local_1fc != 1) {
          if (local_1fc == 2) {
            if (local_18 < 0) {
              local_18 = local_18 + 1;
              if (local_18 < 1) {
                local_18 = -local_18;
              }
              local_1f4 = -local_18 / 2 + -1;
            }
            else {
              local_1f4 = local_18 / 2;
            }
            local_18 = local_1f4;
          }
          else if (local_1fc == 4) {
            if (local_18 < 0) {
              local_18 = local_18 + 1;
              if (local_18 < 1) {
                local_18 = -local_18;
              }
              local_1f8 = -local_18 / 4 + -1;
            }
            else {
              local_1f8 = local_18 / 4;
            }
            local_18 = local_1f8;
          }
          else {
            if (local_18 < 0) {
              local_18 = local_18 + 1;
              if (local_18 < 1) {
                local_18 = -local_18;
              }
              local_1fc = -local_18 / local_1fc + -1;
            }
            else {
              local_1fc = local_18 / local_1fc;
            }
            local_18 = local_1fc;
          }
        }
        (pBVar3->bigend).vect[0] = local_18;
        local_24 = (pBVar3->bigend).vect[1];
        local_20c = local_158[1];
        if (local_20c != 1) {
          if (local_20c == 2) {
            if (local_24 < 0) {
              local_24 = local_24 + 1;
              if (local_24 < 1) {
                local_24 = -local_24;
              }
              local_204 = -local_24 / 2 + -1;
            }
            else {
              local_204 = local_24 / 2;
            }
            local_24 = local_204;
          }
          else if (local_20c == 4) {
            if (local_24 < 0) {
              local_24 = local_24 + 1;
              if (local_24 < 1) {
                local_24 = -local_24;
              }
              local_208 = -local_24 / 4 + -1;
            }
            else {
              local_208 = local_24 / 4;
            }
            local_24 = local_208;
          }
          else {
            if (local_24 < 0) {
              local_24 = local_24 + 1;
              if (local_24 < 1) {
                local_24 = -local_24;
              }
              local_20c = -local_24 / local_20c + -1;
            }
            else {
              local_20c = local_24 / local_20c;
            }
            local_24 = local_20c;
          }
        }
        (pBVar3->bigend).vect[1] = local_24;
        local_30 = (pBVar3->bigend).vect[2];
        local_21c = local_158[2];
        if (local_21c != 1) {
          if (local_21c == 2) {
            if (local_30 < 0) {
              local_30 = local_30 + 1;
              if (local_30 < 1) {
                local_30 = -local_30;
              }
              local_214 = -local_30 / 2 + -1;
            }
            else {
              local_214 = local_30 / 2;
            }
            local_30 = local_214;
          }
          else if (local_21c == 4) {
            if (local_30 < 0) {
              local_30 = local_30 + 1;
              if (local_30 < 1) {
                local_30 = -local_30;
              }
              local_218 = -local_30 / 4 + -1;
            }
            else {
              local_218 = local_30 / 4;
            }
            local_30 = local_218;
          }
          else {
            if (local_30 < 0) {
              local_30 = local_30 + 1;
              if (local_30 < 1) {
                local_30 = -local_30;
              }
              local_21c = -local_30 / local_21c + -1;
            }
            else {
              local_21c = local_30 / local_21c;
            }
            local_30 = local_21c;
          }
        }
        (pBVar3->bigend).vect[2] = local_30;
        local_120 = &pBVar3->bigend;
        local_128 = &local_164;
        local_120->vect[0] = local_164.vect[0] + local_120->vect[0];
        local_104 = 1;
        (pBVar3->bigend).vect[1] = local_164.vect[1] + (pBVar3->bigend).vect[1];
        local_114 = 2;
        (pBVar3->bigend).vect[2] = local_164.vect[2] + (pBVar3->bigend).vect[2];
        local_110 = local_128;
        local_100 = local_128;
      }
    }
  }
  return in_RDI;
}

Assistant:

BoxArray&
BoxArray::growcoarsen (IntVect const& ngrow, const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].grow(ngrow).coarsen(iv);
    }
    return *this;
}